

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilTruth.h
# Opt level: O2

void Abc_TtMakePosUnate(word *t,int nVars)

{
  word wVar1;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  byte bVar5;
  byte bVar6;
  uint uVar7;
  ulong uVar8;
  word *pwVar9;
  ulong uVar10;
  word *pwVar11;
  ulong uVar12;
  word *pLimit;
  ulong uVar13;
  
  uVar7 = 1 << ((char)nVars - 6U & 0x1f);
  if (nVars < 7) {
    uVar7 = 1;
  }
  uVar13 = 0;
  uVar10 = 0;
  if (0 < (int)uVar7) {
    uVar10 = (ulong)uVar7;
  }
  uVar4 = 0;
  if (0 < nVars) {
    uVar4 = (ulong)(uint)nVars;
  }
  do {
    if (uVar13 == uVar4) {
      return;
    }
    iVar2 = Abc_TtNegVar(t,nVars,(int)uVar13);
    if (iVar2 == 0) {
      iVar2 = Abc_TtPosVar(t,nVars,(int)uVar13);
      if (iVar2 == 0) {
        __assert_fail("Abc_TtPosVar(t, nVars, i)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/utilTruth.h"
                      ,0x6f2,"void Abc_TtMakePosUnate(word *, int)");
      }
    }
    else {
      bVar5 = (byte)uVar13;
      if (uVar7 == 1) {
        bVar5 = (byte)(1 << (bVar5 & 0x1f));
        *t = (s_Truths6[uVar13] & *t) >> (bVar5 & 0x3f) | *t << (bVar5 & 0x3f) & s_Truths6[uVar13];
      }
      else if (uVar13 < 6) {
        for (uVar8 = 0; uVar10 != uVar8; uVar8 = uVar8 + 1) {
          bVar6 = (byte)(1 << (bVar5 & 0x1f));
          t[uVar8] = (s_Truths6[uVar13] & t[uVar8]) >> (bVar6 & 0x3f) |
                     t[uVar8] << (bVar6 & 0x3f) & s_Truths6[uVar13];
        }
      }
      else {
        uVar3 = 1 << (bVar5 - 6 & 0x1f);
        iVar2 = 2 << (bVar5 - 6 & 0x1f);
        uVar8 = 0;
        if (0 < (int)uVar3) {
          uVar8 = (ulong)uVar3;
        }
        pwVar9 = t + (int)uVar3;
        for (pwVar11 = t; pwVar11 < t + (int)uVar7; pwVar11 = pwVar11 + iVar2) {
          for (uVar12 = 0; uVar8 != uVar12; uVar12 = uVar12 + 1) {
            wVar1 = pwVar11[uVar12];
            pwVar11[uVar12] = pwVar9[uVar12];
            pwVar9[uVar12] = wVar1;
          }
          pwVar9 = pwVar9 + iVar2;
        }
      }
    }
    uVar13 = uVar13 + 1;
  } while( true );
}

Assistant:

static inline void Abc_TtMakePosUnate( word * t, int nVars )
{
    int i, nWords = Abc_TtWordNum(nVars);
    for ( i = 0; i < nVars; i++ )
        if ( Abc_TtNegVar(t, nVars, i) )
            Abc_TtFlip( t, nWords, i );
        else assert( Abc_TtPosVar(t, nVars, i) );
}